

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O2

void prframe(FILE *file,timeval *tv,int dev,cu_t *cf,char dir)

{
  fprintf((FILE *)file,"(%llu.%06llu) ",tv->tv_sec);
  if (dev < 1) {
    fwrite("canX ",5,1,(FILE *)file);
  }
  else {
    fprintf((FILE *)file,"can%d ",(ulong)(dev - 1));
  }
  snprintf_canframe(prframe::abuf,0x1964,cf,0);
  if (dir == '.') {
    fprintf((FILE *)file,"%s\n",prframe::abuf);
    return;
  }
  fprintf((FILE *)file,"%s %c\n",prframe::abuf,(ulong)(uint)(int)dir);
  return;
}

Assistant:

static void prframe(FILE *file, struct timeval *tv, int dev,
		    cu_t *cf, char dir)
{
	static char abuf[BUFLEN];

	fprintf(file, "(%llu.%06llu) ", (unsigned long long)tv->tv_sec, (unsigned long long)tv->tv_usec);

	if (dev > 0)
		fprintf(file, "can%d ", dev-1);
	else
		fprintf(file, "canX ");

	snprintf_canframe(abuf, sizeof(abuf), cf, 0);

	if (dir == NO_DIR)
		fprintf(file, "%s\n", abuf);
	else
		fprintf(file, "%s %c\n", abuf, dir);
}